

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O1

int Cba_ObjAlloc(Cba_Ntk_t *p,Cba_ObjType_t Type,int nFins,int nFons)

{
  int Entry;
  uint uVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  size_t __size;
  
  Entry = (p->vObjType).nSize;
  if (Type == CBA_OBJ_PI) {
    lVar4 = 0x18;
LAB_00341e36:
    Vec_IntPush((Vec_Int_t *)((long)&p->pDesign + lVar4),Entry);
  }
  else if (Type == CBA_OBJ_PO) {
    lVar4 = 0x28;
    goto LAB_00341e36;
  }
  uVar1 = (p->vObjType).nCap;
  if ((p->vObjType).nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      pcVar3 = (p->vObjType).pArray;
      if (pcVar3 == (char *)0x0) {
        pcVar3 = (char *)malloc(0x10);
      }
      else {
        pcVar3 = (char *)realloc(pcVar3,0x10);
      }
      (p->vObjType).pArray = pcVar3;
      __size = 0x10;
    }
    else {
      __size = (ulong)uVar1 * 2;
      if ((int)__size <= (int)uVar1) goto LAB_00341ea9;
      pcVar3 = (p->vObjType).pArray;
      if (pcVar3 == (char *)0x0) {
        pcVar3 = (char *)malloc(__size);
      }
      else {
        pcVar3 = (char *)realloc(pcVar3,__size);
      }
      (p->vObjType).pArray = pcVar3;
    }
    (p->vObjType).nCap = (int)__size;
  }
LAB_00341ea9:
  iVar2 = (p->vObjType).nSize;
  (p->vObjType).nSize = iVar2 + 1;
  (p->vObjType).pArray[iVar2] = (char)Type;
  if (0 < nFins) {
    do {
      Vec_IntPush(&p->vFinFon,0);
      nFins = nFins + -1;
    } while (nFins != 0);
  }
  if ((p->vObjFin0).nSize != 0) {
    Vec_IntPush(&p->vObjFin0,(p->vFinFon).nSize);
  }
  if (0 < nFons) {
    do {
      Vec_IntPush(&p->vFonObj,Entry);
      nFons = nFons + -1;
    } while (nFons != 0);
  }
  if ((p->vObjFon0).nSize != 0) {
    Vec_IntPush(&p->vObjFon0,(p->vFonObj).nSize);
  }
  return Entry;
}

Assistant:

static inline int Cba_ObjAlloc( Cba_Ntk_t * p, Cba_ObjType_t Type, int nFins, int nFons )
{
    int i, iObj = Vec_StrSize(&p->vObjType);
    if ( Type == CBA_OBJ_PI )
        Vec_IntPush( &p->vInputs, iObj );
    else if ( Type == CBA_OBJ_PO )
        Vec_IntPush( &p->vOutputs, iObj );
    Vec_StrPush( &p->vObjType, (char)Type );
    // add fins
    for ( i = 0; i < nFins; i++ )
        Vec_IntPush( &p->vFinFon, 0 );
    if ( Vec_IntSize(&p->vObjFin0) )
        Vec_IntPush( &p->vObjFin0, Vec_IntSize(&p->vFinFon) );
    // add fons
    for ( i = 0; i < nFons; i++ )
        Vec_IntPush( &p->vFonObj, iObj );
    if ( Vec_IntSize(&p->vObjFon0) )
        Vec_IntPush( &p->vObjFon0, Vec_IntSize(&p->vFonObj) );
    return iObj;
}